

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O3

bool google::protobuf::compiler::objectivec::ValidateObjCClassPrefixes
               (vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                *files,Options *generation_options,string *out_error)

{
  FileDescriptor *pFVar1;
  long lVar2;
  _Base_ptr __n;
  _Alloc_hider __s2;
  size_type __n_00;
  bool bVar3;
  int iVar4;
  pointer ppFVar5;
  const_iterator cVar6;
  long *plVar7;
  ostream *poVar8;
  _Rb_tree_node_base *p_Var9;
  long *plVar10;
  size_type *psVar11;
  ulong *puVar12;
  ulong uVar13;
  char cVar14;
  string other_package_for_prefix;
  string prefix;
  string package;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  expected_package_prefixes;
  ulong *local_1f8;
  long local_1f0;
  ulong local_1e8;
  long lStack_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  Options *local_198;
  string *local_190;
  long *local_188;
  long local_180;
  long local_178;
  long lStack_170;
  long *local_168;
  long local_160;
  long local_158;
  long lStack_150;
  long *local_148;
  long local_140;
  long local_138;
  long lStack_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  *local_e8;
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  key_type local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_198 = generation_options;
  local_190 = out_error;
  local_e8 = files;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((generation_options->expected_prefixes_path)._M_string_length != 0) {
    local_1d8._M_dataplus._M_p = (pointer)&PTR__LineConsumer_00420d30;
    local_1d8._M_string_length = (size_type)&local_60;
    bVar3 = ParseSimpleFile(&generation_options->expected_prefixes_path,(LineConsumer *)&local_1d8,
                            out_error);
    if (!bVar3) {
      bVar3 = false;
      goto LAB_0023253c;
    }
  }
  ppFVar5 = (local_e8->
            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((local_e8->
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish == ppFVar5) {
    bVar3 = true;
  }
  else {
    uVar13 = 0;
    do {
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      pFVar1 = ppFVar5[uVar13];
      lVar2 = **(long **)(*(long *)(pFVar1 + 0xa0) + 0x80);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1d8,lVar2,(*(long **)(*(long *)(pFVar1 + 0xa0) + 0x80))[1] + lVar2
                );
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      lVar2 = **(long **)(pFVar1 + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a0,lVar2,(*(long **)(pFVar1 + 8))[1] + lVar2);
      cVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&local_60,&local_a0);
      if ((_Rb_tree_header *)cVar6._M_node == &local_60._M_impl.super__Rb_tree_header) {
        if ((_Base_ptr)local_1d8._M_string_length == (_Base_ptr)0x0) {
          bVar3 = true;
        }
        else {
          if (0x19 < (byte)(*local_1d8._M_dataplus._M_p + 0xbfU)) {
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x40);
            std::ostream::put(-0x40);
            poVar8 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,"protoc:0: warning: Invalid \'option objc_class_prefix = \"",0x38);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\";\' in \'",8);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,(char *)**(undefined8 **)pFVar1,(*(undefined8 **)pFVar1)[1]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\';",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8," it should start with a capital letter.",0x27);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            std::ostream::flush();
          }
          if (local_1d8._M_string_length < (_Base_ptr)0x3) {
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x40);
            std::ostream::put(-0x40);
            poVar8 = (ostream *)std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8,"protoc:0: warning: Invalid \'option objc_class_prefix = \"",0x38);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\";\' in \'",8);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,(char *)**(undefined8 **)pFVar1,(*(undefined8 **)pFVar1)[1]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\';",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar8," Apple recommends they should be at least 3 characters long.",0x3c);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            std::ostream::flush();
          }
          __n_00 = local_1d8._M_string_length;
          __s2._M_p = local_1d8._M_dataplus._M_p;
          local_1f8 = &local_1e8;
          local_1f0 = 0;
          local_1e8 = local_1e8 & 0xffffffffffffff00;
          bVar3 = true;
          p_Var9 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
          if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
              &local_60._M_impl.super__Rb_tree_header) {
            do {
              if ((p_Var9[2]._M_parent == (_Base_ptr)__n_00) &&
                 (((_Base_ptr)__n_00 == (_Base_ptr)0x0 ||
                  (iVar4 = bcmp(*(void **)(p_Var9 + 2),__s2._M_p,__n_00), iVar4 == 0)))) {
                std::__cxx11::string::_M_assign((string *)&local_1f8);
                bVar3 = local_1f0 == 0;
                break;
              }
              p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
            } while ((_Rb_tree_header *)p_Var9 != &local_60._M_impl.super__Rb_tree_header);
          }
          if (local_a0._M_string_length == 0) {
            cVar14 = (char)*(undefined8 *)(std::cerr + -0x18) + -0x40;
            if (bVar3) {
              std::ios::widen(cVar14);
              std::ostream::put(-0x40);
              poVar8 = (ostream *)std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8,"protoc:0: warning: File \'",0x19);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,(char *)**(undefined8 **)pFVar1,(*(undefined8 **)pFVar1)[1]
                                 );
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\' has no ",9);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8,"package. Consider adding a new package to the proto and adding \'",
                         0x40);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"new.package = ",0xe);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8,"\' to the expected prefixes file (",0x21);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,(local_198->expected_prefixes_path)._M_dataplus._M_p,
                                  (local_198->expected_prefixes_path)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,").",2);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            }
            else {
              std::ios::widen(cVar14);
              std::ostream::put(-0x40);
              poVar8 = (ostream *)std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8,"protoc:0: warning: File \'",0x19);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,(char *)**(undefined8 **)pFVar1,(*(undefined8 **)pFVar1)[1]
                                 );
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\' has no package ",0x11);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"and package \'",0xd);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,(char *)local_1f8,local_1f0);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\' already uses \'",0x10);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8,"\' as its prefix. Consider either adding a new package ",0x36);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8,"to the proto, or reusing one of the packages already using this ",
                         0x40);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8,"prefix in the expected prefixes file (",0x26);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,(local_198->expected_prefixes_path)._M_dataplus._M_p,
                                  (local_198->expected_prefixes_path)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,").",2);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            }
LAB_0023205a:
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            bVar3 = true;
            std::ostream::flush();
          }
          else if (bVar3) {
            if (local_60._M_impl.super__Rb_tree_header._M_node_count != 0) {
              std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x40);
              std::ostream::put(-0x40);
              poVar8 = (ostream *)std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8,
                         "protoc:0: warning: Found unexpected \'option objc_class_prefix = \"",0x41)
              ;
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\";\' in \'",8);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,(char *)**(undefined8 **)pFVar1,(*(undefined8 **)pFVar1)[1]
                                 );
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\';",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8," consider adding it to the expected prefixes file (",0x33);
              poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar8,(local_198->expected_prefixes_path)._M_dataplus._M_p,
                                  (local_198->expected_prefixes_path)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,").",2);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
              goto LAB_0023205a;
            }
            bVar3 = true;
          }
          else {
            std::operator+(&local_80,"error: Found \'option objc_class_prefix = \"",&local_1d8);
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_80);
            plVar10 = plVar7 + 2;
            if ((long *)*plVar7 == plVar10) {
              local_f8 = *plVar10;
              lStack_f0 = plVar7[3];
              local_108 = &local_f8;
            }
            else {
              local_f8 = *plVar10;
              local_108 = (long *)*plVar7;
            }
            local_100 = plVar7[1];
            *plVar7 = (long)plVar10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_108,**(ulong **)pFVar1);
            local_e0 = &local_d0;
            plVar10 = plVar7 + 2;
            if ((long *)*plVar7 == plVar10) {
              local_d0 = *plVar10;
              lStack_c8 = plVar7[3];
            }
            else {
              local_d0 = *plVar10;
              local_e0 = (long *)*plVar7;
            }
            local_d8 = plVar7[1];
            *plVar7 = (long)plVar10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_e0);
            local_c0 = &local_b0;
            plVar10 = plVar7 + 2;
            if ((long *)*plVar7 == plVar10) {
              local_b0 = *plVar10;
              lStack_a8 = plVar7[3];
            }
            else {
              local_b0 = *plVar10;
              local_c0 = (long *)*plVar7;
            }
            local_b8 = plVar7[1];
            *plVar7 = (long)plVar10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_1f8);
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            psVar11 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_128.field_2._M_allocated_capacity = *psVar11;
              local_128.field_2._8_8_ = plVar7[3];
            }
            else {
              local_128.field_2._M_allocated_capacity = *psVar11;
              local_128._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_128._M_string_length = plVar7[1];
            *plVar7 = (long)psVar11;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_128);
            plVar10 = plVar7 + 2;
            if ((long *)*plVar7 == plVar10) {
              local_178 = *plVar10;
              lStack_170 = plVar7[3];
              local_188 = &local_178;
            }
            else {
              local_178 = *plVar10;
              local_188 = (long *)*plVar7;
            }
            local_180 = plVar7[1];
            *plVar7 = (long)plVar10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_188);
            local_168 = &local_158;
            plVar10 = plVar7 + 2;
            if ((long *)*plVar7 == plVar10) {
              local_158 = *plVar10;
              lStack_150 = plVar7[3];
            }
            else {
              local_158 = *plVar10;
              local_168 = (long *)*plVar7;
            }
            local_160 = plVar7[1];
            *plVar7 = (long)plVar10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_168,
                                        (ulong)(local_198->expected_prefixes_path)._M_dataplus._M_p)
            ;
            local_148 = &local_138;
            plVar10 = plVar7 + 2;
            if ((long *)*plVar7 == plVar10) {
              local_138 = *plVar10;
              lStack_130 = plVar7[3];
            }
            else {
              local_138 = *plVar10;
              local_148 = (long *)*plVar7;
            }
            local_140 = plVar7[1];
            *plVar7 = (long)plVar10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_148);
            psVar11 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar11) {
              local_1b8.field_2._M_allocated_capacity = *psVar11;
              local_1b8.field_2._8_8_ = plVar7[3];
              local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
            }
            else {
              local_1b8.field_2._M_allocated_capacity = *psVar11;
              local_1b8._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_1b8._M_string_length = plVar7[1];
            *plVar7 = (long)psVar11;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            std::__cxx11::string::operator=((string *)local_190,(string *)&local_1b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
              operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_148 != &local_138) {
              operator_delete(local_148,local_138 + 1);
            }
            if (local_168 != &local_158) {
              operator_delete(local_168,local_158 + 1);
            }
            if (local_188 != &local_178) {
              operator_delete(local_188,local_178 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_c0 != &local_b0) {
              operator_delete(local_c0,local_b0 + 1);
            }
            if (local_e0 != &local_d0) {
              operator_delete(local_e0,local_d0 + 1);
            }
            if (local_108 != &local_f8) {
              operator_delete(local_108,local_f8 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
            bVar3 = false;
          }
          if (local_1f8 != &local_1e8) {
            operator_delete(local_1f8,local_1e8 + 1);
          }
        }
      }
      else {
        __n = cVar6._M_node[2]._M_parent;
        if ((__n != (_Base_ptr)local_1d8._M_string_length) ||
           ((bVar3 = true, __n != (_Base_ptr)0x0 &&
            (iVar4 = bcmp(*(void **)(cVar6._M_node + 2),local_1d8._M_dataplus._M_p,(size_t)__n),
            iVar4 != 0)))) {
          std::operator+(&local_128,"error: Expected \'option objc_class_prefix = \"",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (cVar6._M_node + 2));
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_128);
          plVar10 = plVar7 + 2;
          if ((long *)*plVar7 == plVar10) {
            local_178 = *plVar10;
            lStack_170 = plVar7[3];
            local_188 = &local_178;
          }
          else {
            local_178 = *plVar10;
            local_188 = (long *)*plVar7;
          }
          local_180 = plVar7[1];
          *plVar7 = (long)plVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_188,(ulong)local_a0._M_dataplus._M_p);
          local_168 = &local_158;
          plVar10 = plVar7 + 2;
          if ((long *)*plVar7 == plVar10) {
            local_158 = *plVar10;
            lStack_150 = plVar7[3];
          }
          else {
            local_158 = *plVar10;
            local_168 = (long *)*plVar7;
          }
          local_160 = plVar7[1];
          *plVar7 = (long)plVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_168);
          local_148 = &local_138;
          plVar10 = plVar7 + 2;
          if ((long *)*plVar7 == plVar10) {
            local_138 = *plVar10;
            lStack_130 = plVar7[3];
          }
          else {
            local_138 = *plVar10;
            local_148 = (long *)*plVar7;
          }
          local_140 = plVar7[1];
          *plVar7 = (long)plVar10;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_148,**(ulong **)pFVar1);
          local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
          psVar11 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_1b8.field_2._M_allocated_capacity = *psVar11;
            local_1b8.field_2._8_8_ = plVar7[3];
          }
          else {
            local_1b8.field_2._M_allocated_capacity = *psVar11;
            local_1b8._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_1b8._M_string_length = plVar7[1];
          *plVar7 = (long)psVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_1b8);
          puVar12 = (ulong *)(plVar7 + 2);
          if ((ulong *)*plVar7 == puVar12) {
            local_1e8 = *puVar12;
            lStack_1e0 = plVar7[3];
            local_1f8 = &local_1e8;
          }
          else {
            local_1e8 = *puVar12;
            local_1f8 = (ulong *)*plVar7;
          }
          local_1f0 = plVar7[1];
          *plVar7 = (long)puVar12;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::string::operator=((string *)local_190,(string *)&local_1f8);
          if (local_1f8 != &local_1e8) {
            operator_delete(local_1f8,local_1e8 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
            operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
          }
          if (local_148 != &local_138) {
            operator_delete(local_148,local_138 + 1);
          }
          if (local_168 != &local_158) {
            operator_delete(local_168,local_158 + 1);
          }
          if (local_188 != &local_178) {
            operator_delete(local_188,local_178 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          if ((_Base_ptr)local_1d8._M_string_length != (_Base_ptr)0x0) {
            std::operator+(&local_1b8,"; but found \'",&local_1d8);
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_1b8);
            local_1f8 = &local_1e8;
            puVar12 = (ulong *)(plVar7 + 2);
            if ((ulong *)*plVar7 == puVar12) {
              local_1e8 = *puVar12;
              lStack_1e0 = plVar7[3];
            }
            else {
              local_1e8 = *puVar12;
              local_1f8 = (ulong *)*plVar7;
            }
            local_1f0 = plVar7[1];
            *plVar7 = (long)puVar12;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_190,(ulong)local_1f8);
            if (local_1f8 != &local_1e8) {
              operator_delete(local_1f8,local_1e8 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
              operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1
                             );
            }
          }
          std::__cxx11::string::append((char *)local_190);
          bVar3 = false;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      if (!bVar3) break;
      uVar13 = uVar13 + 1;
      ppFVar5 = (local_e8->
                super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar13 < (ulong)((long)(local_e8->
                                    super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar5 >> 3
                             ));
  }
LAB_0023253c:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_60);
  return bVar3;
}

Assistant:

bool ValidateObjCClassPrefixes(const vector<const FileDescriptor*>& files,
                               const Options& generation_options,
                               string* out_error) {
  // Load the expected package prefixes, if available, to validate against.
  map<string, string> expected_package_prefixes;
  if (!LoadExpectedPackagePrefixes(generation_options,
                                   &expected_package_prefixes,
                                   out_error)) {
    return false;
  }

  for (int i = 0; i < files.size(); i++) {
    bool is_valid =
        ValidateObjCClassPrefix(files[i],
                                generation_options.expected_prefixes_path,
                                expected_package_prefixes,
                                out_error);
    if (!is_valid) {
      return false;
    }
  }
  return true;
}